

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void libtorrent::aux::anon_unknown_119::on_dht_put_mutable_item
               (alert_manager *alerts,item *i,int num)

{
  sequence_number seq;
  string salt;
  public_key pk;
  signature sig;
  int local_b4;
  int64_t local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  array<char,_32UL> local_88;
  array<char,_64UL> local_68;
  
  if (((alerts->m_alert_mask)._M_i.m_val >> 10 & 1) != 0) {
    local_68._M_elems._0_8_ = *(undefined8 *)(i->m_sig).bytes._M_elems;
    local_68._M_elems._8_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 8);
    local_68._M_elems._16_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x10);
    local_68._M_elems._24_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x18);
    local_68._M_elems._32_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x20);
    local_68._M_elems._40_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x28);
    local_68._M_elems._48_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x30);
    local_68._M_elems._56_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x38);
    local_88._M_elems._0_8_ = *(undefined8 *)(i->m_pk).bytes._M_elems;
    local_88._M_elems._8_8_ = *(undefined8 *)((i->m_pk).bytes._M_elems + 8);
    local_88._M_elems._16_8_ = *(undefined8 *)((i->m_pk).bytes._M_elems + 0x10);
    local_88._M_elems._24_8_ = *(undefined8 *)((i->m_pk).bytes._M_elems + 0x18);
    local_b0 = (i->m_seq).value;
    local_b4 = num;
    ::std::__cxx11::string::string((string *)&local_a8,(string *)&i->m_salt);
    alert_manager::
    emplace_alert<libtorrent::dht_put_alert,std::array<char,32ul>const&,std::array<char,64ul>const&,std::__cxx11::string,long_const&,int&>
              (alerts,&local_88,&local_68,&local_a8,&local_b0,&local_b4);
    ::std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void on_dht_put_mutable_item(aux::alert_manager& alerts, dht::item const& i, int num)
		{
			if (alerts.should_post<dht_put_alert>())
			{
				dht::signature const sig = i.sig();
				dht::public_key const pk = i.pk();
				dht::sequence_number const seq = i.seq();
				std::string salt = i.salt();
				alerts.emplace_alert<dht_put_alert>(pk.bytes, sig.bytes
					, std::move(salt), seq.value, num);
			}
		}